

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O1

void scope_destroy(scope sp)

{
  if (sp != (scope)0x0) {
    set_iterate(sp->objects,scope_destroy_cb_iterate,0);
    set_destroy(sp->objects);
    vector_destroy(sp->call_stack);
    free(sp->name);
    free(sp);
    return;
  }
  return;
}

Assistant:

void scope_destroy(scope sp)
{
	if (sp != NULL)
	{
		set_iterate(sp->objects, &scope_destroy_cb_iterate, NULL);

		set_destroy(sp->objects);

		vector_destroy(sp->call_stack);

		free(sp->name);

		free(sp);
	}
}